

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_si_iec_units.cpp
# Opt level: O0

string * __thiscall
tlx::format_si_units_abi_cxx11_
          (string *__return_storage_ptr__,tlx *this,uint64_t number,int precision)

{
  _Setprecision _Var1;
  ostream *poVar2;
  undefined1 auVar3 [16];
  ostringstream local_1b0 [8];
  ostringstream out;
  double local_38;
  double number_d;
  uint scale;
  double multiplier;
  int precision_local;
  uint64_t number_local;
  
  number_d._4_4_ = 0;
  auVar3._8_4_ = (int)((ulong)this >> 0x20);
  auVar3._0_8_ = this;
  auVar3._12_4_ = 0x45300000;
  for (local_38 = (auVar3._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)this) - 4503599627370496.0); 1000.0 <= local_38;
      local_38 = local_38 / 1000.0) {
    number_d._4_4_ = number_d._4_4_ + 1;
  }
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  poVar2 = (ostream *)std::ostream::operator<<(local_1b0,std::fixed);
  _Var1 = std::setprecision((int)number);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_38);
  poVar2 = std::operator<<(poVar2,' ');
  std::operator<<(poVar2,format_si_units::SI_endings[number_d._4_4_]);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string format_si_units(uint64_t number, int precision) {
    // may not overflow, std::numeric_limits<uint64_t>::max() == 16 EiB
    double multiplier = 1000.0;
    static const char* SI_endings[] = {
        "", "k", "M", "G", "T", "P", "E"
    };
    unsigned int scale = 0;
    double number_d = static_cast<double>(number);
    while (number_d >= multiplier) {
        number_d /= multiplier;
        ++scale;
    }
    std::ostringstream out;
    out << std::fixed << std::setprecision(precision) << number_d
        << ' ' << SI_endings[scale];
    return out.str();
}